

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double value;
  
  value._4_4_ = 0;
  local_20 = 2.0;
  local_28 = 1.0;
  local_30 = 1e-12;
  local_18 = numerary::Numerary::incgamma(&local_20,&local_28,&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"IncGamma(2, 1) = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {

    double value;

    value = Numerary::incgamma(2, 1);

    cout << "IncGamma(2, 1) = " << value << endl;
    
    return 0;
}